

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManInvertPos(Gia_Man_t *pAig)

{
  Gia_Obj_t *pObj;
  int i;
  int v;
  
  v = 0;
  while( true ) {
    if (pAig->vCos->nSize - pAig->nRegs <= v) {
      return;
    }
    pObj = Gia_ManCo(pAig,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    Gia_ObjFlipFaninC0(pObj);
    v = v + 1;
  }
  return;
}

Assistant:

void Gia_ManInvertPos( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFlipFaninC0( pObj );
}